

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

CWalletTx * __thiscall
wallet::CWallet::AddToWallet
          (CWallet *this,CTransactionRef tx,TxState *state,UpdateWalletTxFn *update_wtx,
          bool fFlushOnClose,bool rescanning_old_block)

{
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *pvVar1;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *this_00;
  long lVar2;
  element_type *peVar3;
  pointer pCVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3;
  _Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true> *p_Var10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  WalletDatabase *pWVar15;
  undefined7 extraout_var;
  int64_t iVar17;
  iterator iVar18;
  undefined8 extraout_RAX;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var19;
  iterator iVar20;
  char *parameters_2;
  byte bVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  CTxIn *txin;
  pointer hash_00;
  CWalletTx *pCVar23;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var24;
  CWallet *pCVar25;
  ulong uVar26;
  undefined4 uVar27;
  undefined7 in_register_00000089;
  CWalletTx *pCVar28;
  const_iterator it;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar29;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar30;
  initializer_list<wallet::CWalletTx_*> __l;
  undefined1 in_stack_fffffffffffffe78 [15];
  byte bVar31;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var32;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar33;
  CWallet *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb4;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *this_01;
  allocator<char> local_13a;
  TxStateInactive inactive_state;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_138;
  WalletBatch local_128;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> txs;
  string strCmd;
  uint256 hash;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var16;
  
  _Var22 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pCVar25 = (CWallet *)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar27 = (undefined4)CONCAT71(in_register_00000089,fFlushOnClose);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock22,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x42c,false);
  pWVar15 = GetDatabase(this);
  (*pWVar15->_vptr_WalletDatabase[0xe])(&local_128,pWVar15,(ulong)update_wtx & 0xff);
  peVar3 = (element_type *)(pCVar25->super_WalletStorage)._vptr_WalletStorage;
  hash.super_base_blob<256U>.m_data._M_elems._0_4_ =
       *(undefined4 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  hash.super_base_blob<256U>.m_data._M_elems._4_4_ =
       *(undefined4 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
  hash.super_base_blob<256U>.m_data._M_elems._8_4_ =
       *(undefined4 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  hash.super_base_blob<256U>.m_data._M_elems._12_4_ =
       *(undefined4 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_128.m_database = pWVar15;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 1) != 0) {
    strCmd.field_2._8_8_ = &strCmd._M_string_length;
    strCmd._M_string_length = (ulong)strCmd._M_string_length._4_4_ << 0x20;
    strCmd.field_2._M_allocated_capacity = 0;
    peVar3 = (element_type *)(pCVar25->super_WalletStorage)._vptr_WalletStorage;
    pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (hash_00 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start; hash_00 != pCVar4; hash_00 = hash_00 + 1) {
      SetSpentKeyState(this,&local_128,(uint256 *)hash_00,(hash_00->prevout).n,true,
                       (set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                        *)&strCmd);
    }
    MarkDestinationsDirty
              (this,(set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                     *)&strCmd);
    std::
    _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                 *)&strCmd);
    in_stack_fffffffffffffea8 = pCVar25;
  }
  this_00 = &this->mapWallet;
  txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&hash;
  strCmd._M_dataplus._M_p = (pointer)_Var22._M_pi;
  strCmd._M_string_length = (size_type)pCVar25;
  pVar29 = std::
           _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256&>,std::tuple<std::shared_ptr<CTransaction_const>&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>>
                     ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)this_00,&std::piecewise_construct);
  _Var16._M_cur =
       (__node_type *)
       pVar29.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
       _M_cur;
  pCVar28 = (CWalletTx *)((long)_Var16._M_cur + 0x28);
  bVar21 = pVar29.second;
  if (*(long *)((long)&(state->
                       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ).
                       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ._M_u + 0x10) == 0) {
    uVar33 = 0;
  }
  else {
    bVar11 = std::function<bool_(wallet::CWalletTx_&,_bool)>::operator()
                       ((function<bool_(wallet::CWalletTx_&,_bool)> *)state,pCVar28,
                        (bool)(bVar21 & 1));
    uVar33 = (undefined4)CONCAT71(extraout_var,bVar11);
    pVar29.second = (bool)bVar21;
    pVar29.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
         = (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>)
           (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>)_Var16._M_cur;
    pVar29._9_7_ = 0;
  }
  _Var24._M_cur =
       (__node_type *)
       pVar29.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
       _M_cur;
  if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar31 = (byte)_Var22._M_pi[2]._M_use_count;
    pvVar1 = (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)((long)_Var24._M_cur + 0x1d0);
    if (bVar31 == *(byte *)((long)_Var24._M_cur + 0x1f8)) {
      iVar13 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[bVar31]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)&strCmd,pvVar1);
      _Var24._M_cur = _Var16._M_cur;
      iVar14 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)&strCmd,
                          (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                           *)_Var22._M_pi);
      if (iVar13 != iVar14) {
        __assert_fail("TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x454,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
      _Var32._M_cur = _Var24._M_cur;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr
        [((_Var24._M_cur)->super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
         ).super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
         _M_storage.__data[0x1f0]]._M_data)
                ((uint256 *)&strCmd,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&txs,pvVar1);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
                ((uint256 *)&txs,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_108,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  *)_Var22._M_pi);
      pCVar23 = pCVar28;
      bVar11 = ::operator==((base_blob<256U> *)&strCmd,(base_blob<256U> *)&txs);
      if (!bVar11) {
        __assert_fail("TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x455,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
    }
    else {
      pp_Var5 = (_Var22._M_pi)->_vptr__Sp_counted_base;
      uVar6 = *(undefined8 *)&(_Var22._M_pi)->_M_use_count;
      pp_Var7 = _Var22._M_pi[1]._vptr__Sp_counted_base;
      uVar8 = *(undefined8 *)&_Var22._M_pi[1]._M_use_count;
      uVar9 = *(undefined8 *)((long)&_Var22._M_pi[2]._vptr__Sp_counted_base + 1);
      *(undefined8 *)((long)_Var24._M_cur + 0x1e9) =
           *(undefined8 *)((long)&_Var22._M_pi[1]._M_use_count + 1);
      *(undefined8 *)((long)_Var24._M_cur + 0x1f1) = uVar9;
      *(_func_int ***)((long)_Var24._M_cur + 0x1e0) = pp_Var7;
      *(undefined8 *)((long)_Var24._M_cur + 0x1e8) = uVar8;
      *(_func_int ***)
       &(pvVar1->
        super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ).
        super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ._M_u = pp_Var5;
      *(undefined8 *)((long)_Var24._M_cur + 0x1d8) = uVar6;
      uVar33 = 1;
      pCVar23 = pCVar28;
      _Var32._M_cur = _Var16._M_cur;
    }
    if ((((element_type *)(pCVar25->super_WalletStorage)._vptr_WalletStorage)->m_has_witness == true
        ) && (*(char *)(*(long *)((long)&((_Var24._M_cur)->
                                         super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                         ._M_storage._M_storage + 0x1b8) + 0x38) == '\0')) {
      p_Var10 = &(_Var32._M_cur)->
                 super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>;
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pCVar25)
      ;
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(p_Var10->
                         super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>).
                         _M_storage._M_storage + 0x1b8),&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      uVar33 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
  }
  else {
    iVar17 = GetTime();
    *(int *)((long)&((_Var16._M_cur)->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 0x6c) = (int)iVar17;
    strCmd._M_dataplus._M_p = (pointer)IncOrderPosNext(this,&local_128);
    *(pointer *)
     ((long)&((_Var16._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x78) = strCmd._M_dataplus._M_p;
    pCVar23 = pCVar28;
    _Var32._M_cur = _Var16._M_cur;
    strCmd._M_string_length = (size_type)pCVar28;
    iVar18 = std::
             _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
             ::_M_emplace_equal<std::pair<long,wallet::CWalletTx*>>
                       ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                         *)&this->wtxOrdered,(pair<long,_wallet::CWalletTx_*> *)&strCmd);
    *(_Base_ptr *)
     ((long)&((_Var16._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x80) = iVar18._M_node;
    uVar12 = ComputeTimeSmart(this,pCVar28,SUB41(uVar27,0));
    *(uint *)((long)&((_Var32._M_cur)->
                     super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                     super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                     _M_storage._M_storage + 0x70) = uVar12;
    AddToSpends(this,pCVar23,&local_128);
    pCVar28 = pCVar23;
    iVar17 = CWalletTx::GetTxTime(pCVar23);
    pCVar23 = pCVar28;
    if (iVar17 < (this->m_birth_time).super___atomic_base<long>._M_i) {
      LOCK();
      (this->m_birth_time).super___atomic_base<long>._M_i = iVar17;
      UNLOCK();
    }
  }
  bVar11 = CWalletTx::IsCoinBase(pCVar28);
  this_01 = (_Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             *)CONCAT44(in_stack_fffffffffffffeb4,uVar27);
  if ((bVar11) &&
     (this_01 = (_Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,uVar27),
     ((_Var32._M_cur)->super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
     super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage._M_storage
     .__data[0x1f0] == '\x03')) {
    __l._M_len = 1;
    __l._M_array = (iterator)&strCmd;
    strCmd._M_dataplus._M_p = (pointer)pCVar23;
    std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::vector
              (&txs,__l,(allocator_type *)&local_108);
    inactive_state.abandoned = true;
    this_01 = &(this->mapTxSpends)._M_h;
    while (txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_start !=
           txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_finish) {
      pCVar28 = txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1];
      txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_finish + -1;
      std::
      variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
      ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                   *)&pCVar28->m_state,&inactive_state);
      pCVar28->m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pCVar28->m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pCVar28->m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pCVar28->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pCVar28->m_is_cache_empty = true;
      pCVar28->fChangeCached = false;
      WalletBatch::WriteTx(&local_128,pCVar28);
      MarkInputsDirty(this,&pCVar28->tx);
      uVar26 = 0;
      while( true ) {
        peVar3 = (pCVar28->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((ulong)(((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x28) <= uVar26) break;
        strCmd._M_dataplus._M_p =
             *(pointer *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        strCmd._M_string_length =
             *(size_type *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        strCmd.field_2._M_allocated_capacity =
             *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        strCmd.field_2._8_8_ =
             *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        pVar30 = std::
                 _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(this_01,(key_type *)&strCmd);
        for (_Var19._M_cur =
                  (__node_type *)
                  pVar30.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var19._M_cur !=
            pVar30.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
            _Var19._M_cur = (__node_type *)((_Var19._M_cur)->super__Hash_node_base)._M_nxt) {
          iVar20 = std::
                   _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,
                          (key_type *)
                          ((long)&((_Var19._M_cur)->
                                  super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                                  _M_storage._M_storage + 0x24));
          if (iVar20.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur != (__node_type *)0x0) {
            local_108._M_dataplus._M_p =
                 (pointer)((long)iVar20.
                                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ._M_cur + 0x28);
            std::vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>>::
            emplace_back<wallet::CWalletTx*>
                      ((vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>> *)&txs,
                       (CWalletTx **)&local_108);
          }
        }
        uVar26 = (ulong)((int)uVar26 + 1);
      }
    }
    std::_Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::~_Vector_base
              (&txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>);
    in_stack_fffffffffffffea8 = this;
  }
  base_blob<256u>::ToString_abi_cxx11_(&local_c8,(base_blob<256u> *)&hash);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:126:23)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
    ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
            (&local_e8,(anon_class_1_0_00000001 *)&strCmd,
             (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)_Var22._M_pi);
  parameters_2 = "new";
  if ((bVar21 & 1) == 0) {
    parameters_2 = "";
  }
  parameters._M_string_length._7_1_ = bVar21;
  parameters._0_15_ = in_stack_fffffffffffffe78;
  parameters.field_2._M_allocated_capacity = (size_type)pCVar23;
  parameters.field_2._8_8_ = _Var32._M_cur;
  parameters_3._M_dataplus._M_p._4_4_ = uVar33;
  parameters_3._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe98;
  parameters_3._M_string_length = (size_type)_Var22._M_pi;
  parameters_3.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffea8;
  parameters_3.field_2._8_4_ = (int)this_01;
  parameters_3.field_2._12_4_ = (int)((ulong)this_01 >> 0x20);
  bVar31 = bVar21;
  WalletLogPrintf<std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            (this,"AddToWallet %s  %s%s %s\n",parameters,(char *)&local_c8,parameters_2,parameters_3
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (((((byte)uVar33 | bVar21) & 1) == 0) ||
     (bVar21 = bVar31, bVar11 = WalletBatch::WriteTx(&local_128,pCVar23), bVar11)) {
    *(undefined8 *)
     ((long)&((_Var32._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x88) = 0;
    *(undefined8 *)
     ((long)&((_Var32._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0xd0) = 0;
    *(undefined8 *)
     ((long)&((_Var32._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x118) = 0;
    *(undefined8 *)
     ((long)&((_Var32._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x160) = 0;
    *(undefined2 *)
     ((long)&((_Var32._M_cur)->
             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
             _M_storage + 0x1a8) = 1;
    boost::signals2::
    signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyTransactionChanged,&hash,(byte)~bVar21 & CT_UPDATED);
    std::__cxx11::string::string((string *)&strCmd,&this->m_notify_tx_changed_script);
    if (strCmd._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txs,"%s",(allocator<char> *)&inactive_state);
      base_blob<256u>::GetHex_abi_cxx11_(&local_108,(base_blob<256u> *)&hash);
      util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&txs);
      if (((_Var32._M_cur)->
          super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
          super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
          _M_storage.__data[0x1f0] == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%b",(allocator<char> *)&inactive_state);
        base_blob<256u>::GetHex_abi_cxx11_
                  (&local_108,
                   (base_blob<256u> *)
                   (((_Var32._M_cur)->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage.__data + 0x1c8));
        util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&txs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%h",(allocator<char> *)&inactive_state);
        util::ToString<int>(&local_108,
                            (int *)(((_Var32._M_cur)->
                                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                    ._M_storage._M_storage.__data + 0x1e8));
        util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%b",(allocator<char> *)&inactive_state);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"unconfirmed",&local_13a);
        util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&txs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%h",(allocator<char> *)&inactive_state);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"-1",&local_13a);
        util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
      }
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&txs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txs,"%w",(allocator<char> *)&inactive_state);
      ShellEscape(&local_108,&this->m_name);
      util::ReplaceAll(&strCmd,(string *)&txs,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&txs);
      std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
                ((thread *)&txs,runCommand,&strCmd);
      std::thread::detach();
      std::thread::~thread((thread *)&txs);
    }
    std::__cxx11::string::~string((string *)&strCmd);
  }
  else {
    pCVar23 = (CWalletTx *)0x0;
  }
  if (local_128.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_128.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pCVar23;
  }
  __stack_chk_fail();
}

Assistant:

CWalletTx* CWallet::AddToWallet(CTransactionRef tx, const TxState& state, const UpdateWalletTxFn& update_wtx, bool fFlushOnClose, bool rescanning_old_block)
{
    LOCK(cs_wallet);

    WalletBatch batch(GetDatabase(), fFlushOnClose);

    uint256 hash = tx->GetHash();

    if (IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
        // Mark used destinations
        std::set<CTxDestination> tx_destinations;

        for (const CTxIn& txin : tx->vin) {
            const COutPoint& op = txin.prevout;
            SetSpentKeyState(batch, op.hash, op.n, true, tx_destinations);
        }

        MarkDestinationsDirty(tx_destinations);
    }

    // Inserts only if not already there, returns tx inserted or tx found
    auto ret = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(tx, state));
    CWalletTx& wtx = (*ret.first).second;
    bool fInsertedNew = ret.second;
    bool fUpdated = update_wtx && update_wtx(wtx, fInsertedNew);
    if (fInsertedNew) {
        wtx.nTimeReceived = GetTime();
        wtx.nOrderPos = IncOrderPosNext(&batch);
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
        wtx.nTimeSmart = ComputeTimeSmart(wtx, rescanning_old_block);
        AddToSpends(wtx, &batch);

        // Update birth time when tx time is older than it.
        MaybeUpdateBirthTime(wtx.GetTxTime());
    }

    if (!fInsertedNew)
    {
        if (state.index() != wtx.m_state.index()) {
            wtx.m_state = state;
            fUpdated = true;
        } else {
            assert(TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state));
            assert(TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state));
        }
        // If we have a witness-stripped version of this transaction, and we
        // see a new version with a witness, then we must be upgrading a pre-segwit
        // wallet.  Store the new version of the transaction with the witness,
        // as the stripped-version must be invalid.
        // TODO: Store all versions of the transaction, instead of just one.
        if (tx->HasWitness() && !wtx.tx->HasWitness()) {
            wtx.SetTx(tx);
            fUpdated = true;
        }
    }

    // Mark inactive coinbase transactions and their descendants as abandoned
    if (wtx.IsCoinBase() && wtx.isInactive()) {
        std::vector<CWalletTx*> txs{&wtx};

        TxStateInactive inactive_state = TxStateInactive{/*abandoned=*/true};

        while (!txs.empty()) {
            CWalletTx* desc_tx = txs.back();
            txs.pop_back();
            desc_tx->m_state = inactive_state;
            // Break caches since we have changed the state
            desc_tx->MarkDirty();
            batch.WriteTx(*desc_tx);
            MarkInputsDirty(desc_tx->tx);
            for (unsigned int i = 0; i < desc_tx->tx->vout.size(); ++i) {
                COutPoint outpoint(desc_tx->GetHash(), i);
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(outpoint);
                for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
                    const auto wit = mapWallet.find(it->second);
                    if (wit != mapWallet.end()) {
                        txs.push_back(&wit->second);
                    }
                }
            }
        }
    }

    //// debug print
    WalletLogPrintf("AddToWallet %s  %s%s %s\n", hash.ToString(), (fInsertedNew ? "new" : ""), (fUpdated ? "update" : ""), TxStateString(state));

    // Write to disk
    if (fInsertedNew || fUpdated)
        if (!batch.WriteTx(wtx))
            return nullptr;

    // Break debit/credit balance caches:
    wtx.MarkDirty();

    // Notify UI of new or updated transaction
    NotifyTransactionChanged(hash, fInsertedNew ? CT_NEW : CT_UPDATED);

#if HAVE_SYSTEM
    // notify an external script when a wallet transaction comes in or is updated
    std::string strCmd = m_notify_tx_changed_script;

    if (!strCmd.empty())
    {
        ReplaceAll(strCmd, "%s", hash.GetHex());
        if (auto* conf = wtx.state<TxStateConfirmed>())
        {
            ReplaceAll(strCmd, "%b", conf->confirmed_block_hash.GetHex());
            ReplaceAll(strCmd, "%h", ToString(conf->confirmed_block_height));
        } else {
            ReplaceAll(strCmd, "%b", "unconfirmed");
            ReplaceAll(strCmd, "%h", "-1");
        }
#ifndef WIN32
        // Substituting the wallet name isn't currently supported on windows
        // because windows shell escaping has not been implemented yet:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-537384875
        // A few ways it could be implemented in the future are described in:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-461288094
        ReplaceAll(strCmd, "%w", ShellEscape(GetName()));
#endif
        std::thread t(runCommand, strCmd);
        t.detach(); // thread runs free
    }
#endif

    return &wtx;
}